

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONTestPresets.cxx
# Opt level: O0

ReadFileResult anon_unknown.dwarf_b18c9b::TestPresetExecutionModeHelper(ModeEnum *out,Value *value)

{
  bool bVar1;
  String local_80;
  String local_60;
  String local_40;
  Value *local_20;
  Value *value_local;
  ModeEnum *out_local;
  
  if (value == (Value *)0x0) {
    out_local._4_4_ = READ_OK;
  }
  else {
    local_20 = value;
    value_local = (Value *)out;
    bVar1 = Json::Value::isString(value);
    if (bVar1) {
      Json::Value::asString_abi_cxx11_(&local_40,local_20);
      bVar1 = std::operator==(&local_40,"until-fail");
      std::__cxx11::string::~string((string *)&local_40);
      if (bVar1) {
        *(undefined4 *)&value_local->value_ = 0;
        out_local._4_4_ = READ_OK;
      }
      else {
        Json::Value::asString_abi_cxx11_(&local_60,local_20);
        bVar1 = std::operator==(&local_60,"until-pass");
        std::__cxx11::string::~string((string *)&local_60);
        if (bVar1) {
          *(undefined4 *)&value_local->value_ = 1;
          out_local._4_4_ = READ_OK;
        }
        else {
          Json::Value::asString_abi_cxx11_(&local_80,local_20);
          bVar1 = std::operator==(&local_80,"after-timeout");
          std::__cxx11::string::~string((string *)&local_80);
          if (bVar1) {
            *(undefined4 *)&value_local->value_ = 2;
            out_local._4_4_ = READ_OK;
          }
          else {
            out_local._4_4_ = INVALID_PRESET;
          }
        }
      }
    }
    else {
      out_local._4_4_ = INVALID_PRESET;
    }
  }
  return out_local._4_4_;
}

Assistant:

ReadFileResult TestPresetExecutionModeHelper(
  TestPreset::ExecutionOptions::RepeatOptions::ModeEnum& out,
  const Json::Value* value)
{
  if (!value) {
    return ReadFileResult::READ_OK;
  }

  if (!value->isString()) {
    return ReadFileResult::INVALID_PRESET;
  }

  if (value->asString() == "until-fail") {
    out = TestPreset::ExecutionOptions::RepeatOptions::ModeEnum::UntilFail;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "until-pass") {
    out = TestPreset::ExecutionOptions::RepeatOptions::ModeEnum::UntilPass;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "after-timeout") {
    out = TestPreset::ExecutionOptions::RepeatOptions::ModeEnum::AfterTimeout;
    return ReadFileResult::READ_OK;
  }

  return ReadFileResult::INVALID_PRESET;
}